

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O3

void __thiscall
Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>::Queue
          (Queue<std::vector<signed_char,_std::allocator<signed_char>_>_> *this,size_t capacity)

{
  *(undefined8 *)((long)&(this->m_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->m_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_).super___mutex_base._M_mutex + 8) = 0;
  (this->m_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->cv_);
  this->elements_ = 0;
  this->capacity_ = capacity;
  this->closed_ = false;
  (this->write_).
  super__Deque_base<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->write_).
  super__Deque_base<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->write_).
  super__Deque_base<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->write_).
  super__Deque_base<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->write_).
  super__Deque_base<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->write_).
  super__Deque_base<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->write_).
  super__Deque_base<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->write_).
  super__Deque_base<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->write_).
  super__Deque_base<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->write_).
  super__Deque_base<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
  ::_M_initialize_map(&(this->write_).
                       super__Deque_base<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
                      ,0);
  (this->read_).
  super__Deque_base<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->read_).
  super__Deque_base<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->read_).
  super__Deque_base<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->read_).
  super__Deque_base<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->read_).
  super__Deque_base<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->read_).
  super__Deque_base<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->read_).
  super__Deque_base<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->read_).
  super__Deque_base<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->read_).
  super__Deque_base<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->read_).
  super__Deque_base<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
  ::_M_initialize_map(&(this->read_).
                       super__Deque_base<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
                      ,0);
  return;
}

Assistant:

Queue(size_t capacity) :
      elements_(0),
      capacity_(capacity),
      closed_(false) {
  }